

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsMessageResize(HelicsMessage message,int newSize,HelicsError *err)

{
  HelicsMessage pvVar1;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (message == (HelicsMessage)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001afe47;
    }
    else {
      pvVar1 = (HelicsMessage)0x0;
      if (*(short *)((long)message + 10) == 0xb3) {
        pvVar1 = message;
      }
      if (*(short *)((long)message + 10) == 0xb3 || err == (HelicsError *)0x0) goto LAB_001afe4a;
    }
    err->error_code = -4;
    err->message = "The message object was not valid";
  }
LAB_001afe47:
  pvVar1 = (HelicsMessage)0x0;
LAB_001afe4a:
  if (pvVar1 != (HelicsMessage)0x0) {
    helics::SmallBuffer::reserve((SmallBuffer *)((long)pvVar1 + 0x10),(long)newSize);
    *(long *)((long)pvVar1 + 0x50) = (long)newSize;
  }
  return;
}

Assistant:

void helicsMessageResize(HelicsMessage message, int newSize, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        mess->data.resize(newSize);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}